

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledevice.cpp
# Opt level: O3

qint64 __thiscall QFileDevice::readLineData(QFileDevice *this,char *data,qint64 maxlen)

{
  QObjectData *pQVar1;
  QBindingStatus *pQVar2;
  bool bVar3;
  char cVar4;
  long lVar5;
  
  pQVar1 = (this->super_QIODevice).super_QObject.d_ptr.d;
  if (*(char *)&pQVar1[5].parent == '\x01') {
    *(undefined1 *)&pQVar1[5].parent = 0;
    bVar3 = flush((QFileDevice *)pQVar1->q_ptr);
    if (!bVar3) {
      return -1;
    }
  }
  pQVar2 = pQVar1[4].bindingStorage.bindingStatus;
  cVar4 = (**(code **)(pQVar2->currentlyEvaluatingBinding[2].alreadyCaptureProperties.
                       super_QVLAStorage<8UL,_8UL,_8LL>.array + 0x28))(pQVar2,1);
  if (cVar4 == '\0') {
    lVar5 = QIODevice::readLineData(&this->super_QIODevice,data,maxlen);
  }
  else {
    pQVar2 = pQVar1[4].bindingStorage.bindingStatus;
    lVar5 = (**(code **)(pQVar2->currentlyEvaluatingBinding[2].alreadyCaptureProperties.
                         super_QVLAStorage<8UL,_8UL,_8LL>.array + 0x10))(pQVar2,data,maxlen);
  }
  if (lVar5 < maxlen) {
    pQVar1[5]._vptr_QObjectData = (_func_int **)0x0;
  }
  return lVar5;
}

Assistant:

qint64 QFileDevice::readLineData(char *data, qint64 maxlen)
{
    Q_D(QFileDevice);
    if (!d->ensureFlushed())
        return -1;

    qint64 read;
    if (d->fileEngine->supportsExtension(QAbstractFileEngine::FastReadLineExtension)) {
        read = d->fileEngine->readLine(data, maxlen);
    } else {
        // Fall back to QIODevice's readLine implementation if the engine
        // cannot do it faster.
        read = QIODevice::readLineData(data, maxlen);
    }

    if (read < maxlen) {
        // failed to read all requested, may be at the end of file, stop caching size so that it's rechecked
        d->cachedSize = 0;
    }

    return read;
}